

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O1

int If_CutSopBalancePinDelays(If_Man_t *p,If_Cut_t *pCut,char *pPerm)

{
  float fVar1;
  Vec_Int_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int pTimes [15];
  int local_48 [18];
  
  uVar5 = *(uint *)&pCut->field_0x1c;
  iVar4 = 0;
  if (0xffffff < uVar5) {
    if ((uVar5 & 0xff000000) == 0x1000000) {
      *pPerm = '\0';
      if (*(uint *)&pCut->field_0x1c < 0x1000000) {
        __assert_fail("i >= 0 && i < (int)pCut->nLeaves",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                      ,0x19b,"If_Obj_t *If_CutLeaf(If_Man_t *, If_Cut_t *, int)");
      }
      fVar1 = pCut[1].Area;
      if (((long)(int)fVar1 < 0) || (p->vObjs->nSize <= (int)fVar1)) {
LAB_0041c41a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar4 = (int)*(float *)((long)p->vObjs->pArray[(int)fVar1] + 0x5c);
    }
    else {
      if (pCut->iCutFunc < 0) {
        __assert_fail("pCut->iCutFunc >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                      ,0x1b4,"int If_CutTruthLit(If_Cut_t *)");
      }
      uVar5 = uVar5 >> 0x18;
      uVar6 = (uint)pCut->iCutFunc >> 1;
      if (p->vTtIsops[uVar5]->nSize <= (int)uVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar2 = p->vTtIsops[uVar5]->pArray;
      if (pVVar2[uVar6].nSize == 0) {
        iVar4 = -1;
      }
      else {
        pVVar3 = p->vObjs;
        uVar7 = 0;
        do {
          fVar1 = (&pCut[1].Area)[uVar7];
          if (((long)(int)fVar1 < 0) || (pVVar3->nSize <= (int)fVar1)) goto LAB_0041c41a;
          local_48[uVar7] = (int)*(float *)((long)pVVar3->pArray[(int)fVar1] + 0x5c);
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
        iVar4 = If_CutSopBalancePinDelaysIntInt(pVVar2 + uVar6,local_48,uVar5,pPerm);
      }
    }
  }
  return iVar4;
}

Assistant:

int If_CutSopBalancePinDelays( If_Man_t * p, If_Cut_t * pCut, char * pPerm )
{
    if ( pCut->nLeaves == 0 ) // const
        return 0;
    if ( pCut->nLeaves == 1 ) // variable
    {
        pPerm[0] = 0;
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    }
    else
    {
        Vec_Int_t * vCover;
        int i, pTimes[IF_MAX_FUNC_LUTSIZE];
        vCover = Vec_WecEntry( p->vTtIsops[pCut->nLeaves], Abc_Lit2Var(If_CutTruthLit(pCut)) );
        if ( Vec_IntSize(vCover) == 0 )
            return -1;
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
            pTimes[i] = (int)If_ObjCutBest(If_CutLeaf(p, pCut, i))->Delay; 
        return If_CutSopBalancePinDelaysIntInt( vCover, pTimes, If_CutLeaveNum(pCut), pPerm );
    }
}